

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# previewImageExamples.cpp
# Opt level: O2

void previewImageExamples(void)

{
  ostream *poVar1;
  Array2D<Imf_3_2::Rgba> p;
  Array2D<Imf_3_2::Rgba> local_20;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\nfiles with preview images\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"drawing image then writing file");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_20._sizeX = 600;
  local_20._sizeY = 800;
  local_20._data = (Rgba *)operator_new__(0x3a9800);
  drawImage1(&local_20,800,600);
  writeRgbaWithPreview1("rgbaWithPreview1.exr",&local_20,800,600);
  poVar1 = std::operator<<((ostream *)&std::cout,"drawing image while writing file");
  std::endl<char,std::char_traits<char>>(poVar1);
  writeRgbaWithPreview2("rgbaWithPreview2.exr",800,600);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(&local_20);
  return;
}

Assistant:

void
previewImageExamples ()
{
    cout << "\nfiles with preview images\n" << endl;

    cout << "drawing image then writing file" << endl;

    int w = 800;
    int h = 600;

    Array2D<Rgba> p (h, w);
    drawImage1 (p, w, h);
    writeRgbaWithPreview1 ("rgbaWithPreview1.exr", p, w, h);

    cout << "drawing image while writing file" << endl;

    writeRgbaWithPreview2 ("rgbaWithPreview2.exr", w, h);

    cout << endl;
}